

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::anon_unknown_0::FieldGroup::Append
          (FieldGroup *this,FieldGroup *other)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  const_iterator __first;
  const_iterator __last;
  float local_70;
  float local_60;
  float local_4c;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_28;
  const_iterator local_20;
  FieldGroup *local_18;
  FieldGroup *other_local;
  FieldGroup *this_local;
  
  local_18 = other;
  other_local = this;
  bVar3 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::empty(&other->fields_);
  if (!bVar3) {
    fVar1 = this->preferred_location_;
    sVar4 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(&this->fields_);
    local_4c = (float)sVar4;
    fVar2 = local_18->preferred_location_;
    sVar4 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(&local_18->fields_);
    local_60 = (float)sVar4;
    sVar4 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(&this->fields_);
    sVar5 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(&local_18->fields_);
    local_70 = (float)(sVar4 + sVar5);
    this->preferred_location_ = (fVar1 * local_4c + fVar2 * local_60) / local_70;
    local_28._M_current =
         (FieldDescriptor **)
         std::
         vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ::end(&this->fields_);
    __gnu_cxx::
    __normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
    ::__normal_iterator<google::protobuf::FieldDescriptor_const**>
              ((__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
                *)&local_20,&local_28);
    __first = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::begin(&local_18->fields_);
    __last = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::end(&local_18->fields_);
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::
    insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,void>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)&this->fields_,local_20,
               (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                )__first._M_current,
               (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                )__last._M_current);
  }
  return;
}

Assistant:

void Append(const FieldGroup& other) {
    if (other.fields_.empty()) {
      return;
    }
    // Preferred location is the average among all the fields, so we weight by
    // the number of fields on each FieldGroup object.
    preferred_location_ =
        (preferred_location_ * fields_.size() +
         (other.preferred_location_ * other.fields_.size())) /
        (fields_.size() + other.fields_.size());
    fields_.insert(fields_.end(), other.fields_.begin(), other.fields_.end());
  }